

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNtk.c
# Opt level: O2

void Wlc_NtkSetRefs(Wlc_Ntk_t *p)

{
  Vec_Int_t *p_00;
  int i;
  Wlc_Obj_t *pWVar1;
  int in_EDX;
  int i_00;
  int iVar2;
  
  p_00 = &p->vRefs;
  Vec_IntFill(p_00,p->iObj,in_EDX);
  iVar2 = 1;
  while( true ) {
    if (p->iObj <= iVar2) break;
    pWVar1 = Wlc_NtkObj(p,iVar2);
    for (i_00 = 0; i_00 < (int)pWVar1->nFanins; i_00 = i_00 + 1) {
      i = Wlc_ObjFaninId(pWVar1,i_00);
      Vec_IntAddToEntry(p_00,i,1);
    }
    iVar2 = iVar2 + 1;
  }
  for (iVar2 = 0; iVar2 < (p->vCos).nSize; iVar2 = iVar2 + 1) {
    pWVar1 = Wlc_NtkCo(p,iVar2);
    Vec_IntAddToEntry(p_00,(int)(((long)pWVar1 - (long)p->pObjs) / 0x18),1);
  }
  return;
}

Assistant:

void Wlc_NtkSetRefs( Wlc_Ntk_t * p )
{
    Wlc_Obj_t * pObj; int i, k, Fanin;
    Vec_IntFill( &p->vRefs, Wlc_NtkObjNumMax(p), 0 );
    Wlc_NtkForEachObj( p, pObj, i )
        Wlc_ObjForEachFanin( pObj, Fanin, k )
            Vec_IntAddToEntry( &p->vRefs, Fanin, 1 );
    Wlc_NtkForEachCo( p, pObj, i )
        Vec_IntAddToEntry( &p->vRefs, Wlc_ObjId(p, pObj), 1 );
}